

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_make(JPCommonLabel *label)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  undefined8 *__ptr;
  int *in_RDI;
  bool bVar9;
  int short_pause_flag;
  char **phoneme_list;
  JPCommonLabelBreathGroup *b;
  JPCommonLabelAccentPhrase *a;
  JPCommonLabelWord *w;
  JPCommonLabelPhoneme *p;
  char buff [1024];
  int tmp3;
  int tmp2;
  int tmp1;
  int i;
  undefined4 uVar11;
  undefined8 uVar10;
  int in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  char *local_4e8;
  int local_4dc;
  char *local_4b0;
  int local_4a4;
  char *local_488;
  int local_47c;
  int local_458;
  JPCommonLabelBreathGroup *local_448;
  JPCommonLabelAccentPhrase *local_440;
  long local_438;
  undefined8 *local_430;
  char local_428 [1032];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int *local_10;
  
  local_430 = *(undefined8 **)(in_RDI + 0x14);
  *in_RDI = 0;
  for (; local_430 != (undefined8 *)0x0; local_430 = *(undefined8 **)((long)local_430 + 0x10)) {
    *in_RDI = *in_RDI + 1;
  }
  if (*in_RDI < 1) {
    fprintf(_stderr,"WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n");
  }
  else {
    *in_RDI = *in_RDI + 2;
    local_10 = in_RDI;
    pvVar8 = calloc((long)*in_RDI,8);
    *(void **)(local_10 + 2) = pvVar8;
    for (local_14 = 0; local_14 < *local_10; local_14 = local_14 + 1) {
      pvVar8 = calloc(0x400,1);
      *(void **)(*(long *)(local_10 + 2) + (long)local_14 * 8) = pvVar8;
    }
    __ptr = (undefined8 *)calloc((long)(*local_10 + 4),8);
    *__ptr = "xx";
    __ptr[1] = "xx";
    __ptr[2] = "sil";
    __ptr[*local_10 + 1] = "sil";
    __ptr[*local_10 + 2] = "xx";
    __ptr[*local_10 + 3] = "xx";
    local_14 = 3;
    for (local_430 = *(undefined8 **)(local_10 + 0x14); local_430 != (undefined8 *)0x0;
        local_430 = (undefined8 *)local_430[2]) {
      __ptr[local_14] = *local_430;
      local_14 = local_14 + 1;
    }
    local_14 = 0;
    local_430 = *(undefined8 **)(local_10 + 0x14);
    for (; local_14 < *local_10; local_14 = local_14 + 1) {
      iVar1 = strcmp((char *)*local_430,"pau");
      bVar9 = iVar1 == 0;
      uVar10 = __ptr[local_14 + 4];
      sprintf(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),"%s^%s-%s+%s=%s",
              __ptr[local_14],__ptr[local_14 + 1],__ptr[local_14 + 2],__ptr[local_14 + 3],uVar10);
      uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) || (bVar9)) {
        sprintf(local_428,"/A:xx+xx+xx");
      }
      else {
        local_18 = index_mora_in_accent_phrase((JPCommonLabelMora *)local_430[3]);
        if (**(int **)(*(long *)(local_430[3] + 0x28) + 0x40) == 0) {
          local_458 = count_mora_in_accent_phrase((JPCommonLabelMora *)local_430[3]);
        }
        else {
          local_458 = **(int **)(*(long *)(local_430[3] + 0x28) + 0x40);
        }
        local_1c = local_458;
        uVar5 = limit(local_18 - local_458,-0x31,0x31);
        uVar6 = limit(local_18,1,0x31);
        iVar1 = count_mora_in_accent_phrase((JPCommonLabelMora *)local_430[3]);
        uVar7 = limit((iVar1 - local_18) + 1,1,0x31);
        sprintf(local_428,"/A:%d+%d+%d",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_438 = *(long *)(*(long *)(local_430[1] + 0x18) + 0x28);
      }
      else if (*(long *)(*(long *)(local_430[3] + 0x28) + 0x30) == 0) {
        local_438 = 0;
      }
      else if (local_14 == *local_10 + -1) {
        local_438 = *(long *)(local_430[3] + 0x28);
      }
      else {
        local_438 = *(long *)(*(long *)(local_430[3] + 0x28) + 0x30);
      }
      if (local_438 == 0) {
        sprintf(local_428,"/B:xx-xx_xx");
        iVar1 = in_stack_fffffffffffffaa0;
      }
      else {
        sprintf(local_428,"/B:%s-%s_%s",*(undefined8 *)(local_438 + 8),
                *(undefined8 *)(local_438 + 0x10),*(undefined8 *)(local_438 + 0x18));
        iVar1 = in_stack_fffffffffffffaa0;
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) || (bVar9)) {
        sprintf(local_428,"/C:xx_xx+xx");
      }
      else {
        sprintf(local_428,"/C:%s_%s+%s",*(undefined8 *)(*(long *)(local_430[3] + 0x28) + 8),
                *(undefined8 *)(*(long *)(local_430[3] + 0x28) + 0x10),
                *(undefined8 *)(*(long *)(local_430[3] + 0x28) + 0x18));
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_438 = *(long *)(*(long *)(local_430[2] + 0x18) + 0x28);
      }
      else if (*(long *)(*(long *)(local_430[3] + 0x28) + 0x38) == 0) {
        local_438 = 0;
      }
      else if (local_14 == 0) {
        local_438 = *(long *)(local_430[3] + 0x28);
      }
      else {
        local_438 = *(long *)(*(long *)(local_430[3] + 0x28) + 0x38);
      }
      if (local_438 == 0) {
        sprintf(local_428,"/D:xx+xx_xx");
      }
      else {
        sprintf(local_428,"/D:%s+%s_%s",*(undefined8 *)(local_438 + 8),
                *(undefined8 *)(local_438 + 0x10),*(undefined8 *)(local_438 + 0x18));
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_440 = *(JPCommonLabelAccentPhrase **)
                     (*(long *)(*(long *)(local_430[1] + 0x18) + 0x28) + 0x40);
      }
      else if (local_14 == *local_10 + -1) {
        local_440 = *(JPCommonLabelAccentPhrase **)(*(long *)(local_430[3] + 0x28) + 0x40);
      }
      else {
        local_440 = *(JPCommonLabelAccentPhrase **)
                     (*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x20);
      }
      if (local_440 == (JPCommonLabelAccentPhrase *)0x0) {
        sprintf(local_428,"/E:xx_xx!xx_xx");
      }
      else {
        iVar2 = count_mora_in_accent_phrase
                          (*(JPCommonLabelMora **)(*(long *)((long)local_440 + 0x10) + 0x20));
        uVar5 = limit(iVar2,1,0x31);
        if (local_440->accent == 0) {
          local_47c = count_mora_in_accent_phrase
                                (*(JPCommonLabelMora **)(*(long *)((long)local_440 + 0x10) + 0x20));
        }
        else {
          local_47c = local_440->accent;
        }
        uVar6 = limit(local_47c,1,0x31);
        if (*(long *)((long)local_440 + 8) == 0) {
          local_488 = "0";
        }
        else {
          local_488 = *(char **)((long)local_440 + 8);
        }
        sprintf(local_428,"/E:%d_%d!%s_xx",(ulong)uVar5,(ulong)uVar6,local_488);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) ||
         ((bVar9 || (local_440 == (JPCommonLabelAccentPhrase *)0x0)))) {
        sprintf(local_428,"-xx");
      }
      else {
        iVar2 = strcmp((char *)**(undefined8 **)
                                 (*(long *)(*(long *)(*(long *)((long)local_440 + 0x18) + 0x28) +
                                           0x10) + 0x10),"pau");
        sprintf(local_428,"-%d",(ulong)(iVar2 != 0));
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) || (bVar9)) {
        local_440 = (JPCommonLabelAccentPhrase *)0x0;
      }
      else {
        local_440 = *(JPCommonLabelAccentPhrase **)(*(long *)(local_430[3] + 0x28) + 0x40);
      }
      if (local_440 == (JPCommonLabelAccentPhrase *)0x0) {
        sprintf(local_428,"/F:xx_xx#xx_xx@xx_xx|xx_xx");
      }
      else {
        local_18 = index_accent_phrase_in_breath_group(local_440);
        local_1c = index_mora_in_breath_group(local_440->head->head);
        iVar1 = count_mora_in_accent_phrase(local_440->head->head);
        uVar5 = limit(iVar1,1,0x31);
        if (local_440->accent == 0) {
          local_4a4 = count_mora_in_accent_phrase(local_440->head->head);
        }
        else {
          local_4a4 = local_440->accent;
        }
        uVar6 = limit(local_4a4,1,0x31);
        if (local_440->emotion == (char *)0x0) {
          local_4b0 = "0";
        }
        else {
          local_4b0 = local_440->emotion;
        }
        uVar7 = limit(local_18,1,0x31);
        iVar1 = count_accent_phrase_in_breath_group(local_440);
        iVar2 = limit((iVar1 - local_18) + 1,1,0x31);
        iVar1 = limit(local_1c,1,99);
        iVar4 = count_mora_in_breath_group(local_440->head->head);
        iVar4 = limit((iVar4 - local_1c) + 1,1,99);
        uVar10 = CONCAT44(uVar11,iVar2);
        sprintf(local_428,"/F:%d_%d#%s_xx@%d_%d|%d_%d",(ulong)uVar5,(ulong)uVar6,local_4b0,
                (ulong)uVar7,uVar10,iVar1,iVar4);
        uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_440 = *(JPCommonLabelAccentPhrase **)
                     (*(long *)(*(long *)(local_430[2] + 0x18) + 0x28) + 0x40);
      }
      else if (local_14 == 0) {
        local_440 = *(JPCommonLabelAccentPhrase **)(*(long *)(local_430[3] + 0x28) + 0x40);
      }
      else {
        local_440 = *(JPCommonLabelAccentPhrase **)
                     (*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x28);
      }
      if (local_440 == (JPCommonLabelAccentPhrase *)0x0) {
        sprintf(local_428,"/G:xx_xx%%xx_xx");
      }
      else {
        iVar2 = count_mora_in_accent_phrase
                          (*(JPCommonLabelMora **)(*(long *)((long)local_440 + 0x10) + 0x20));
        uVar5 = limit(iVar2,1,0x31);
        if (local_440->accent == 0) {
          local_4dc = count_mora_in_accent_phrase
                                (*(JPCommonLabelMora **)(*(long *)((long)local_440 + 0x10) + 0x20));
        }
        else {
          local_4dc = local_440->accent;
        }
        uVar6 = limit(local_4dc,1,0x31);
        if (*(long *)((long)local_440 + 8) == 0) {
          local_4e8 = "0";
        }
        else {
          local_4e8 = *(char **)((long)local_440 + 8);
        }
        sprintf(local_428,"/G:%d_%d%%%s_xx",(ulong)uVar5,(ulong)uVar6,local_4e8);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) ||
         ((bVar9 || (local_440 == (JPCommonLabelAccentPhrase *)0x0)))) {
        sprintf(local_428,"_xx");
      }
      else {
        iVar2 = strcmp((char *)**(undefined8 **)
                                 (*(long *)(*(long *)(*(long *)((long)local_440 + 0x10) + 0x20) + 8)
                                 + 8),"pau");
        sprintf(local_428,"_%d",(ulong)(iVar2 != 0));
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(*(long *)(local_430[1] + 0x18) + 0x28) + 0x40) + 0x30);
      }
      else if (local_14 == *local_10 + -1) {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x30);
      }
      else {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x30) + 0x10);
      }
      if (local_448 == (JPCommonLabelBreathGroup *)0x0) {
        sprintf(local_428,"/H:xx_xx");
      }
      else {
        iVar2 = count_accent_phrase_in_breath_group(local_448->head);
        uVar5 = limit(iVar2,1,0x31);
        iVar2 = count_mora_in_breath_group
                          (*(JPCommonLabelMora **)(*(long *)(*(long *)local_448 + 0x10) + 0x20));
        uVar6 = limit(iVar2,1,99);
        sprintf(local_428,"/H:%d_%d",(ulong)uVar5,(ulong)uVar6);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (((local_14 == 0) || (local_14 == *local_10 + -1)) || (bVar9)) {
        local_448 = (JPCommonLabelBreathGroup *)0x0;
      }
      else {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x30);
      }
      if (local_448 == (JPCommonLabelBreathGroup *)0x0) {
        sprintf(local_428,"/I:xx-xx@xx+xx&xx-xx|xx+xx");
        in_stack_fffffffffffffaa0 = iVar1;
      }
      else {
        local_18 = index_breath_group_in_utterance(local_448);
        local_1c = index_accent_phrase_in_utterance(local_448->head);
        local_20 = index_mora_in_utterance(local_448->head->head->head);
        iVar2 = count_accent_phrase_in_breath_group(local_448->head);
        uVar5 = limit(iVar2,1,0x31);
        iVar2 = count_mora_in_breath_group(local_448->head->head->head);
        uVar6 = limit(iVar2,1,99);
        uVar7 = limit(local_18,1,0x13);
        iVar2 = count_breath_group_in_utterance
                          ((JPCommonLabelBreathGroup *)CONCAT44(in_stack_fffffffffffffaa4,iVar1));
        uVar3 = limit((iVar2 - local_18) + 1,1,0x13);
        iVar2 = limit(local_1c,1,0x31);
        iVar4 = count_accent_phrase_in_utterance
                          ((JPCommonLabelAccentPhrase *)CONCAT44(in_stack_fffffffffffffaa4,iVar1));
        in_stack_fffffffffffffaa0 = limit((iVar4 - local_1c) + 1,1,0x31);
        iVar4 = limit(local_20,1,199);
        iVar1 = count_mora_in_utterance
                          ((JPCommonLabelMora *)CONCAT44(in_stack_fffffffffffffaa4,iVar1));
        iVar1 = limit((iVar1 - local_20) + 1,1,199);
        sprintf(local_428,"/I:%d-%d@%d+%d&%d-%d|%d+%d",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
                (ulong)uVar3,CONCAT44(uVar11,iVar2),in_stack_fffffffffffffaa0,iVar4,iVar1);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if (bVar9) {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(*(long *)(local_430[2] + 0x18) + 0x28) + 0x40) + 0x30);
      }
      else if (local_14 == 0) {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x30);
      }
      else {
        local_448 = *(JPCommonLabelBreathGroup **)
                     (*(long *)(*(long *)(*(long *)(local_430[3] + 0x28) + 0x40) + 0x30) + 0x18);
      }
      if (local_448 == (JPCommonLabelBreathGroup *)0x0) {
        sprintf(local_428,"/J:xx_xx");
      }
      else {
        iVar1 = count_accent_phrase_in_breath_group(local_448->head);
        uVar5 = limit(iVar1,1,0x31);
        iVar1 = count_mora_in_breath_group
                          (*(JPCommonLabelMora **)(*(long *)(*(long *)local_448 + 0x10) + 0x20));
        uVar6 = limit(iVar1,1,99);
        sprintf(local_428,"/J:%d_%d",(ulong)uVar5,(ulong)uVar6);
      }
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      iVar1 = count_breath_group_in_utterance
                        ((JPCommonLabelBreathGroup *)
                         CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      uVar5 = limit(iVar1,1,0x13);
      iVar1 = count_accent_phrase_in_utterance
                        ((JPCommonLabelAccentPhrase *)
                         CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      uVar6 = limit(iVar1,1,0x31);
      iVar1 = count_mora_in_utterance
                        ((JPCommonLabelMora *)
                         CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      uVar7 = limit(iVar1,1,199);
      sprintf(local_428,"/K:%d+%d-%d",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
      strcat(*(char **)(*(long *)(local_10 + 2) + (long)local_14 * 8),local_428);
      if ((0 < local_14) && (local_14 < *local_10 + -2)) {
        local_430 = (undefined8 *)local_430[2];
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void JPCommonLabel_make(JPCommonLabel * label)
{
   int i, tmp1, tmp2, tmp3;
   char buff[MAXBUFLEN];
   JPCommonLabelPhoneme *p;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   char **phoneme_list;
   int short_pause_flag;

   /* initialize */
   for (p = label->phoneme_head, label->size = 0; p != NULL; p = p->next)
      label->size++;
   if (label->size < 1) {
      fprintf(stderr, "WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n");
      return;
   }
   label->size += 2;
   label->feature = (char **) calloc(label->size, sizeof(char *));
   for (i = 0; i < label->size; i++)
      label->feature[i] = (char *) calloc(MAXBUFLEN, sizeof(char));

   /* phoneme list */
   phoneme_list = (char **) calloc(label->size + 4, sizeof(char *));
   phoneme_list[0] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[1] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[2] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 1] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 2] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[label->size + 3] = JPCOMMON_PHONEME_UNKNOWN;
   for (i = 3, p = label->phoneme_head; p != NULL; p = p->next)
      phoneme_list[i++] = p->phoneme;

   for (i = 0, p = label->phoneme_head; i < label->size; i++) {
      if (strcmp(p->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
         short_pause_flag = 1;
      else
         short_pause_flag = 0;

      /* for phoneme */
      sprintf(label->feature[i], "%s^%s-%s+%s=%s", phoneme_list[i], phoneme_list[i + 1],
              phoneme_list[i + 2], phoneme_list[i + 3], phoneme_list[i + 4]);
      /* for A: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         sprintf(buff, "/A:xx+xx+xx");
      else {
         tmp1 = index_mora_in_accent_phrase(p->up);
         tmp2 =
             p->up->up->up->accent ==
             0 ? count_mora_in_accent_phrase(p->up) : p->up->up->up->accent;
         sprintf(buff, "/A:%d+%d+%d", limit(tmp1 - tmp2, -MAX_M, MAX_M), limit(tmp1, 1, MAX_M),
                 limit(count_mora_in_accent_phrase(p->up) - tmp1 + 1, 1, MAX_M));
      }
      strcat(label->feature[i], buff);
      /* for B: */
      if (short_pause_flag == 1)
         w = p->prev->up->up;
      else if (p->up->up->prev == NULL)
         w = NULL;
      else if (i == label->size - 1)
         w = p->up->up;
      else
         w = p->up->up->prev;
      if (w == NULL)
         sprintf(buff, "/B:xx-xx_xx");
      else
         sprintf(buff, "/B:%s-%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for C: */
      if (i == 0 || i == label->size - 1 || short_pause_flag)
         sprintf(buff, "/C:xx_xx+xx");
      else
         sprintf(buff, "/C:%s_%s+%s", p->up->up->pos, p->up->up->ctype, p->up->up->cform);
      strcat(label->feature[i], buff);
      /* for D: */
      if (short_pause_flag == 1)
         w = p->next->up->up;
      else if (p->up->up->next == NULL)
         w = NULL;
      else if (i == 0)
         w = p->up->up;
      else
         w = p->up->up->next;
      if (w == NULL)
         sprintf(buff, "/D:xx+xx_xx");
      else
         sprintf(buff, "/D:%s+%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for E: */
      if (short_pause_flag == 1)
         a = p->prev->up->up->up;
      else if (i == label->size - 1)
         a = p->up->up->up;
      else
         a = p->up->up->up->prev;
      if (a == NULL)
         sprintf(buff, "/E:xx_xx!xx_xx");
      else
         sprintf(buff, "/E:%d_%d!%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "-xx");
      else
         sprintf(buff, "-%d",
                 strcmp(a->tail->tail->tail->next->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for F: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         a = NULL;
      else
         a = p->up->up->up;
      if (a == NULL)
         sprintf(buff, "/F:xx_xx#xx_xx@xx_xx|xx_xx");
      else {
         tmp1 = index_accent_phrase_in_breath_group(a);
         tmp2 = index_mora_in_breath_group(a->head->head);
         sprintf(buff, "/F:%d_%d#%s_xx@%d_%d|%d_%d",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion, limit(tmp1, 1, MAX_M),
                 limit(count_accent_phrase_in_breath_group(a) - tmp1 + 1, 1, MAX_M), limit(tmp2, 1,
                                                                                           MAX_L),
                 limit(count_mora_in_breath_group(a->head->head) - tmp2 + 1, 1, MAX_L));
      }
      strcat(label->feature[i], buff);
      /* for G: */
      if (short_pause_flag == 1)
         a = p->next->up->up->up;
      else if (i == 0)
         a = p->up->up->up;
      else
         a = p->up->up->up->next;
      if (a == NULL)
         sprintf(buff, "/G:xx_xx%%xx_xx");
      else
         sprintf(buff, "/G:%d_%d%%%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "_xx");
      else
         sprintf(buff, "_%d",
                 strcmp(a->head->head->head->prev->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for H: */
      if (short_pause_flag == 1)
         b = p->prev->up->up->up->up;
      else if (i == label->size - 1)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->prev;
      if (b == NULL)
         sprintf(buff, "/H:xx_xx");
      else
         sprintf(buff, "/H:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for I: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         b = NULL;
      else
         b = p->up->up->up->up;
      if (b == NULL)
         sprintf(buff, "/I:xx-xx@xx+xx&xx-xx|xx+xx");
      else {
         tmp1 = index_breath_group_in_utterance(b);
         tmp2 = index_accent_phrase_in_utterance(b->head);
         tmp3 = index_mora_in_utterance(b->head->head->head);
         sprintf(buff, "/I:%d-%d@%d+%d&%d-%d|%d+%d",
                 limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L), limit(tmp1, 1,
                                                                                         MAX_S),
                 limit(count_breath_group_in_utterance(b) - tmp1 + 1, 1, MAX_S), limit(tmp2, 1,
                                                                                       MAX_M),
                 limit(count_accent_phrase_in_utterance(b->head) - tmp2 + 1, 1, MAX_M), limit(tmp3,
                                                                                              1,
                                                                                              MAX_LL),
                 limit(count_mora_in_utterance(b->head->head->head) - tmp3 + 1, 1, MAX_LL));
      }
      strcat(label->feature[i], buff);
      /* for J: */
      if (short_pause_flag == 1)
         b = p->next->up->up->up->up;
      else if (i == 0)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->next;
      if (b == NULL)
         sprintf(buff, "/J:xx_xx");
      else
         sprintf(buff, "/J:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for K: */
      sprintf(buff, "/K:%d+%d-%d",
              limit(count_breath_group_in_utterance(label->breath_head), 1, MAX_S),
              limit(count_accent_phrase_in_utterance(label->accent_head), 1, MAX_M),
              limit(count_mora_in_utterance(label->mora_head), 1, MAX_LL));
      strcat(label->feature[i], buff);

      if (0 < i && i < label->size - 2)
         p = p->next;
   }

   /* free */
   free(phoneme_list);
}